

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarantool_call.c
# Opt level: O0

int64_t CallTarantoolFunction(tnt_stream *stream,char *name,char *format,...)

{
  char in_AL;
  tnt_request *req;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [24];
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  int64_t local_50;
  int64_t result;
  va_list list;
  tnt_stream *arguments;
  tnt_request *request;
  char *format_local;
  char *name_local;
  tnt_stream *stream_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  req = tnt_request_call_16((tnt_request *)0x0);
  list[0].reg_save_area = tnt_object((tnt_stream *)0x0);
  list[0].overflow_arg_area = local_108;
  list[0]._0_8_ = &stack0x00000008;
  result._4_4_ = 0x30;
  result._0_4_ = 0x18;
  tnt_object_vformat((tnt_stream *)list[0].reg_save_area,format,(__va_list_tag *)&result);
  tnt_request_set_funcz(req,name);
  tnt_request_set_tuple(req,(tnt_stream *)list[0].reg_save_area);
  local_50 = tnt_request_compile(stream,req);
  tnt_stream_free((tnt_stream *)list[0].reg_save_area);
  tnt_request_free(req);
  tnt_flush(stream);
  return local_50;
}

Assistant:

int64_t CallTarantoolFunction(struct tnt_stream* stream, const char* name,
			       const char* format, ...)
{
	struct tnt_request* request   = tnt_request_call_16(NULL);
	struct tnt_stream*  arguments = tnt_object(NULL);

	va_list list;
	va_start(list, format);
	tnt_object_vformat(arguments, format, list);
	va_end(list);

	tnt_request_set_funcz(request, name);
	tnt_request_set_tuple(request, arguments);

	int64_t result = tnt_request_compile(stream, request);

	tnt_stream_free(arguments);
	tnt_request_free(request);
	tnt_flush(stream);

	return result;
}